

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O2

double pae(jas_matrix_t *x,jas_matrix_t *y)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  lVar2 = x->numrows_;
  if (x->numrows_ < 1) {
    lVar2 = 0;
  }
  dVar8 = 0.0;
  for (lVar3 = 0; lVar3 != lVar2; lVar3 = lVar3 + 1) {
    lVar4 = x->numcols_;
    if (x->numcols_ < 1) {
      lVar4 = 0;
    }
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      lVar6 = y->rows_[lVar3][lVar5] - x->rows_[lVar3][lVar5];
      lVar7 = -lVar6;
      if (0 < lVar6) {
        lVar7 = lVar6;
      }
      dVar1 = (double)lVar7;
      if ((double)lVar7 <= dVar8) {
        dVar1 = dVar8;
      }
      dVar8 = dVar1;
    }
  }
  return dVar8;
}

Assistant:

double pae(jas_matrix_t *x, jas_matrix_t *y)
{
	double s;
	double d;

	s = 0.0;
	for (jas_matind_t i = 0; i < jas_matrix_numrows(x); i++) {
		for (jas_matind_t j = 0; j < jas_matrix_numcols(x); j++) {
			d = JAS_ABS(jas_matrix_get(y, i, j) - jas_matrix_get(x, i, j));
			if (d > s) {
				s = d;
			}
		}
	}

	return s;
}